

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

int __thiscall ON_MappingChannel::Compare(ON_MappingChannel *this,ON_MappingChannel *other)

{
  int local_1c;
  int rc;
  ON_MappingChannel *other_local;
  ON_MappingChannel *this_local;
  
  local_1c = this->m_mapping_channel_id - other->m_mapping_channel_id;
  if (local_1c == 0) {
    local_1c = ON_UuidCompare(&this->m_mapping_id,&other->m_mapping_id);
  }
  if (local_1c == 0) {
    local_1c = ON_Xform::Compare(&this->m_object_xform,&other->m_object_xform);
  }
  return local_1c;
}

Assistant:

int ON_MappingChannel::Compare( const ON_MappingChannel& other ) const
{
  int rc = m_mapping_channel_id - other.m_mapping_channel_id;
  if (!rc)
    rc = ON_UuidCompare(m_mapping_id,other.m_mapping_id);
  if (!rc)
    rc = m_object_xform.Compare(other.m_object_xform);
  return rc;
}